

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O0

void __thiscall
adios2::transportman::TransportMan::FlushFiles(TransportMan *this,int transportIndex)

{
  bool bVar1;
  element_type *peVar2;
  int in_ESI;
  char *in_RDI;
  iterator itTransport;
  shared_ptr<adios2::Transport> *transport;
  pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_> *transportPair;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
  *__range3;
  string *in_stack_00000100;
  TransportMan *in_stack_00000108;
  const_iterator in_stack_00000110;
  unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [12];
  int in_stack_ffffffffffffff9c;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
  local_20;
  char *local_18;
  
  if (in_ESI == -1) {
    local_18 = in_RDI + 8;
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
         ::begin(in_stack_ffffffffffffff48);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
         ::end(in_stack_ffffffffffffff48);
    while (bVar1 = std::__detail::operator!=(&local_20,&local_28), bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
      ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                   *)0xd67bf4);
      std::__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0xd67c1d);
      bVar1 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xd67c43);
        (*peVar2->_vptr_Transport[10])();
      }
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                    *)in_stack_ffffffffffffff50);
    }
  }
  else {
    std::
    unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
    ::find(in_stack_ffffffffffffff48,(key_type *)0xd67c85);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                *)in_stack_ffffffffffffff50,
               (_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                *)in_stack_ffffffffffffff48);
    __rhs = &local_90;
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+(in_RDI,__rhs);
    CheckFile(in_stack_00000108,in_stack_00000110,in_stack_00000100);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                  *)0xd67cfb);
    peVar2 = std::__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xd67d07);
    (*peVar2->_vptr_Transport[10])();
  }
  return;
}

Assistant:

void TransportMan::FlushFiles(const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;

            if (transport->m_Type == "File")
            {
                transport->Flush();
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to FlushFiles with index " + std::to_string(transportIndex));
        itTransport->second->Flush();
    }
}